

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBarrelShape.cpp
# Opt level: O2

cbtVector3 __thiscall
cbtBarrelShape::localGetSupportingVertexWithoutMargin(cbtBarrelShape *this,cbtVector3 *vec0)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  cbtVector3 cVar8;
  cbtVector3 local_38;
  float local_24;
  float local_20;
  float local_1c;
  
  fVar6 = vec0->m_floats[0];
  local_1c = vec0->m_floats[2];
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar6)),ZEXT416((uint)local_1c),
                           ZEXT416((uint)local_1c));
  auVar2 = vsqrtss_avx(auVar2,auVar2);
  fVar7 = auVar2._0_4_;
  local_1c = local_1c / fVar7;
  local_20 = atanf((vec0->m_floats[1] * this->R_vert) / (fVar7 * this->R_hor));
  fVar5 = this->R_vert;
  fVar3 = sinf(local_20);
  local_24 = this->R_hor;
  fVar4 = cosf(local_20);
  local_38.m_floats[2] = fVar4 * local_24 + this->R_offset;
  local_38.m_floats[0] = local_38.m_floats[2] * (fVar6 / fVar7);
  local_38.m_floats[2] = local_38.m_floats[2] * local_1c;
  local_38.m_floats[3] = 0.0;
  local_38.m_floats[1] = fVar3 * fVar5;
  cbtVector3::length(&local_38);
  fVar6 = this->Y_high;
  fVar5 = this->R_vert;
  auVar2._8_4_ = 0x7fffffff;
  auVar2._0_8_ = 0x7fffffff7fffffff;
  auVar2._12_4_ = 0x7fffffff;
  auVar2 = vandps_avx512vl(ZEXT416((uint)fVar6),auVar2);
  if ((auVar2._0_4_ < fVar5) && (fVar6 < local_38.m_floats[1])) {
    fVar3 = this->R_hor;
    fVar6 = 1.0 - (fVar6 / fVar5) * (fVar6 / fVar5);
    if (fVar6 < 0.0) {
      fVar6 = sqrtf(fVar6);
    }
    else {
      auVar2 = vsqrtss_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6));
      fVar6 = auVar2._0_4_;
    }
    local_38.m_floats[2] = fVar7 / (fVar3 * fVar6 + this->R_offset);
    local_38.m_floats[0] = vec0->m_floats[0] / local_38.m_floats[2];
    local_38.m_floats[2] = vec0->m_floats[2] / local_38.m_floats[2];
    local_38.m_floats[1] = this->Y_high;
    local_38.m_floats[3] = 0.0;
    fVar5 = this->R_vert;
  }
  fVar6 = *(float *)&(this->super_cbtConvexInternalShape).field_0x44;
  auVar1._8_4_ = 0x7fffffff;
  auVar1._0_8_ = 0x7fffffff7fffffff;
  auVar1._12_4_ = 0x7fffffff;
  auVar2 = vandps_avx512vl(ZEXT416((uint)fVar6),auVar1);
  if ((auVar2._0_4_ < fVar5) && (local_38.m_floats[1] < fVar6)) {
    fVar3 = this->R_hor;
    fVar6 = 1.0 - (fVar6 / fVar5) * (fVar6 / fVar5);
    if (fVar6 < 0.0) {
      fVar6 = sqrtf(fVar6);
    }
    else {
      auVar2 = vsqrtss_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6));
      fVar6 = auVar2._0_4_;
    }
    fVar7 = fVar7 / (fVar3 * fVar6 + this->R_offset);
    local_38.m_floats[0] = vec0->m_floats[0] / fVar7;
    local_38.m_floats[2] = vec0->m_floats[2] / fVar7;
    local_38.m_floats[1] = *(cbtScalar *)&(this->super_cbtConvexInternalShape).field_0x44;
    local_38.m_floats[3] = 0.0;
  }
  cVar8.m_floats[0] = local_38.m_floats[0];
  cVar8.m_floats[1] = local_38.m_floats[1];
  cVar8.m_floats[2] = local_38.m_floats[2];
  cVar8.m_floats[3] = local_38.m_floats[3];
  return (cbtVector3)cVar8.m_floats;
}

Assistant:

cbtVector3	cbtBarrelShape::localGetSupportingVertexWithoutMargin(const cbtVector3& vec0)const
{
	cbtVector3 supVec(0,0,0);
	cbtVector3 supVecD;

	// suppport point on the lathed ellipse?
	cbtScalar pY = vec0.y();
	cbtScalar pR = std::sqrt(vec0.z()*vec0.z() + vec0.x()*vec0.x());
	cbtScalar pH = pR;
	cbtScalar dX = vec0.x()/pR;
	cbtScalar dZ = vec0.z()/pR;
	cbtScalar tpar = std::atan((pY*R_vert)/(pH*R_hor));
	cbtScalar sY = R_vert * std::sin(tpar);
	cbtScalar sH = R_hor  * std::cos(tpar);
	cbtScalar sR = sH + R_offset;
	cbtScalar sX = dX * sR;
	cbtScalar sZ = dZ * sR;
	supVec.setValue(sX,sY,sZ);
	cbtScalar len = supVec.length();

	// support point on the top disc?
    if ((std::abs(Y_high) < R_vert) && (supVec.y() > Y_high)) {
        cbtScalar R_high_ellips = R_hor * std::sqrt(cbtScalar(1) - std::pow(Y_high / R_vert, cbtScalar(2)));
        cbtScalar R_high = R_high_ellips + R_offset;
        cbtScalar rad_ratio = pR / R_high;
        supVecD.setValue(vec0.x() / rad_ratio, Y_high, vec0.z() / rad_ratio);
        supVec = supVecD;
    }
    // support point on the bottom disc?
    if ((std::abs(Y_low) < R_vert) && (supVec.y() < Y_low)) {
        cbtScalar R_low_ellips = R_hor * std::sqrt(cbtScalar(1) - std::pow(Y_low / R_vert, cbtScalar(2)));
        cbtScalar R_low = R_low_ellips + R_offset;
        cbtScalar rad_ratio = pR / R_low;
        supVecD.setValue(vec0.x() / rad_ratio, Y_low, vec0.z() / rad_ratio);
        supVec = supVecD;
    }

	return supVec;
}